

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall cfd::core::Psbt::CheckTxInIndex(Psbt *this,uint32_t index,int line,char *caller)

{
  void *pvVar1;
  CfdException *pCVar2;
  CfdSourceLocation location;
  uint32_t local_5c;
  undefined1 local_58 [32];
  CfdSourceLocation local_38;
  
  pvVar1 = this->wally_psbt_pointer_;
  local_5c = index;
  if (pvVar1 == (void *)0x0) {
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0xcf0;
    local_58._16_8_ = "CheckTxInIndex";
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"psbt pointer is null.","")
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_58);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)((long)pvVar1 + 8) == 0) {
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0xcf3;
    local_58._16_8_ = "CheckTxInIndex";
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt base tx is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"psbt base tx is null.","")
    ;
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_58);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_38.line = line;
  local_38.funcname = caller;
  if (*(ulong *)((long)pvVar1 + 0x18) <= (ulong)index) {
    local_38.filename = "cfdcore_psbt.cpp";
    logger::log<unsigned_int&>(&local_38,kCfdLogLevelWarning,"psbt vin[{}] out_of_range.",&local_5c)
    ;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"psbt vin out_of_range error.","");
    CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)local_58);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((ulong)index < *(ulong *)(*(long *)((long)pvVar1 + 8) + 0x10)) {
    return;
  }
  local_38.filename = "cfdcore_psbt.cpp";
  logger::log<unsigned_int&>(&local_38,kCfdLogLevelWarning,"tx vin[{}] out_of_range.",&local_5c);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"tx vin out_of_range error.","");
  CfdException::CfdException(pCVar2,kCfdOutOfRangeError,(string *)local_58);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::CheckTxInIndex(uint32_t index, int line, const char *caller) const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  } else if (psbt_pointer->num_inputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "psbt vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "psbt vin out_of_range error.");
  } else if (psbt_pointer->tx->num_inputs <= index) {
    CfdSourceLocation location = {CFD_LOG_FILE, line, caller};
    warn(location, "tx vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "tx vin out_of_range error.");
  }
}